

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

int __thiscall branch_and_reduce_algorithm::packingReduction(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  bool bVar7;
  FILE *__stream;
  uint uVar8;
  uint *puVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  pointer piVar11;
  ulong uVar12;
  iterator __begin8;
  int *piVar13;
  pointer *ppiVar14;
  iterator __end8;
  long lVar15;
  ulong uVar16;
  int iVar17;
  pointer pvVar18;
  vector<int,_std::allocator<int>_> *pvVar19;
  ulong uVar20;
  int iVar21;
  int j;
  int iVar22;
  int *piVar23;
  iterator iVar24;
  int *piVar25;
  vector<int,std::allocator<int>> *pvVar26;
  int j_1;
  int *piVar27;
  uint uVar28;
  vector<int,_std::allocator<int>_> copyOfTmp;
  vector<int,_std::allocator<int>_> x2;
  int local_dc;
  ulong local_d8;
  uint local_cc;
  ulong local_c8;
  uint local_bc;
  ulong local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  int *local_a8;
  int local_a0;
  int local_9c;
  string local_98;
  vector<int,std::allocator<int>> *local_78;
  vector<int,std::allocator<int>> *local_70;
  pointer *local_68;
  pointer *local_60;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_58;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_cc = this->rn;
  local_b0 = &this->x;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,local_b0);
  local_bc = 0;
  pvVar18 = (this->packing).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->packing).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar18) {
    local_50 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->packing;
    local_60 = &(this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_70 = (vector<int,std::allocator<int>> *)&this->b_vtcs;
    local_68 = &(this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_78 = (vector<int,std::allocator<int>> *)&this->packing_vtcs;
    local_58 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->packingCandidates;
    uVar16 = 0;
    iVar21 = -1;
    do {
      if (iVar21 != this->rn) {
        if (0 < this->N) {
          piVar11 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15] = piVar11[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 < this->N);
        }
        iVar21 = this->modifiedN + 1;
        lVar15 = (ulong)(uint)this->modifiedN << 4;
        while( true ) {
          iVar21 = iVar21 + -1;
          if (iVar21 < 1) break;
          (**(code **)(**(long **)((long)&(this->modifieds).
                                          super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].
                                          super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_ptr + lVar15) + 0x18))();
          lVar15 = lVar15 + -0x10;
        }
        iVar21 = this->rn;
      }
      pvVar18 = pvVar18 + uVar16;
      puVar9 = (uint *)(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
      local_c8 = (long)(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar9;
      uVar28 = *puVar9;
      local_b8 = 0;
      local_d8 = 0;
      local_9c = iVar21;
      if (4 < local_c8) {
        local_d8 = 0;
        local_b8 = 0;
        uVar16 = 1;
        uVar12 = 2;
        do {
          uVar8 = puVar9[uVar16];
          if ((USE_DEPENDENCY_CHECKING == true) &&
             (pvVar2 = (this->packingMap).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             _Var10 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                (pvVar2[(int)uVar8].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 *(pointer *)
                                  ((long)&pvVar2[(int)uVar8].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 8),&local_bc),
             _Var10._M_current ==
             *(pointer *)
              ((long)&(this->packingMap).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar8].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              + 8))) {
            __assert_fail("!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x8e3,"int branch_and_reduce_algorithm::packingReduction()");
          }
          iVar21 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar8];
          if (iVar21 < 0) {
            iVar21 = (int)local_b8;
            local_b8 = (ulong)(iVar21 + 1);
            (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] = uVar8;
            iVar21 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar8];
          }
          local_d8 = (ulong)((int)local_d8 + (uint)(iVar21 == 1));
          puVar9 = (uint *)(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
          bVar7 = uVar12 < (ulong)((long)(pvVar18->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >>
                                  2);
          uVar16 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar7);
      }
      uVar8 = (int)(local_c8 >> 2) + ~uVar28;
      local_c8 = (ulong)uVar8;
      uVar28 = (uint)local_b8;
      if ((int)uVar8 < (int)(uint)local_d8) {
LAB_00111a98:
        uVar28 = 0xffffffff;
        goto LAB_00111a9d;
      }
      if ((int)uVar28 < 1 || (uint)local_d8 != uVar8) {
        if ((int)uVar8 < (int)((uint)local_d8 + uVar28)) {
          if ((int)uVar28 < 2) {
            __assert_fail("size >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x924,"int branch_and_reduce_algorithm::packingReduction()");
          }
          iVar21 = (this->used).uid;
          (this->used).uid = iVar21 + 1;
          if (iVar21 < -1) {
            piVar11 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar15 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar11;
            if (lVar15 != 0) {
              uVar16 = 0;
              do {
                piVar11[uVar16] = 0;
                uVar16 = uVar16 + 1;
              } while ((uVar16 & 0xffffffff) < (ulong)(lVar15 >> 2));
            }
            (this->used).uid = 1;
          }
          piVar23 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar11 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = local_b8 & 0xffffffff;
          uVar12 = 0;
          do {
            piVar3[piVar23[uVar12]] = (this->used).uid;
            piVar11[piVar23[uVar12]] = -1;
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
          pvVar18 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar27 = pvVar18[*piVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_a8 = *(pointer *)
                      ((long)&pvVar18[*piVar23].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data + 8);
          if (piVar27 != local_a8) {
            local_a0 = (uint)local_d8 + 1;
            uVar12 = local_b8;
            do {
              iVar21 = *piVar27;
              piVar11 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if ((piVar11[iVar21] < 0) &&
                 (piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start, piVar3[iVar21] != (this->used).uid)) {
                pvVar18 = (this->adj).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                piVar23 = pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar25 = *(pointer *)
                           ((long)&pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8);
                if (piVar23 == piVar25) {
                  iVar22 = 0;
                  if ((int)local_c8 < (int)local_d8) {
                    _Var10._M_current =
                         (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    *_Var10._M_current = 2;
LAB_0011173c:
                    lVar15 = 1;
                    goto LAB_00111741;
                  }
LAB_0011183e:
                  if (((0x1f < (uint)BRANCHING) || ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) == 0))
                     || (iVar22 + local_a0 <= (int)local_c8)) goto LAB_001118ec;
                  lVar15 = 0;
                  uVar20 = uVar16;
                  do {
                    piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    iVar21 = *(int *)((long)piVar11 + lVar15);
                    if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar21] == -1) {
                      if (BRANCHING == 0x1f) {
                        iVar24._M_current =
                             (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        ppiVar14 = local_68;
                        pvVar26 = local_78;
                        if (iVar24._M_current ==
                            (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_001118d5:
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    (pvVar26,iVar24,(int *)((long)piVar11 + lVar15));
                          goto LAB_001118dd;
                        }
                      }
                      else {
                        iVar24._M_current =
                             (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                        ppiVar14 = local_60;
                        pvVar26 = local_70;
                        if (iVar24._M_current ==
                            (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) goto LAB_001118d5;
                      }
                      *iVar24._M_current = iVar21;
                      *ppiVar14 = iVar24._M_current + 1;
                    }
LAB_001118dd:
                    lVar15 = lVar15 + 4;
                    uVar20 = uVar20 - 1;
                  } while (uVar20 != 0);
                  bVar7 = false;
                }
                else {
                  piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar22 = 0;
                  piVar13 = piVar23;
                  do {
                    if (piVar3[*piVar13] == (this->used).uid) {
                      iVar22 = iVar22 + 1;
                      piVar4[*piVar13] = 1;
                    }
                    piVar13 = piVar13 + 1;
                  } while (piVar13 != piVar25);
                  if ((int)local_d8 + iVar22 <= (int)local_c8) goto LAB_0011183e;
                  _Var10._M_current =
                       (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  *_Var10._M_current = 2;
                  if (piVar23 == piVar25) goto LAB_0011173c;
                  iVar22 = 1;
                  do {
                    if (piVar11[*piVar23] < 0) {
                      lVar15 = (long)iVar22;
                      iVar22 = iVar22 + 1;
                      _Var10._M_current[lVar15] = *piVar23;
                    }
                    piVar23 = piVar23 + 1;
                  } while (piVar23 != piVar25);
                  lVar15 = (long)iVar22;
LAB_00111741:
                  std::vector<int,std::allocator<int>>::
                  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                            ((vector<int,std::allocator<int>> *)&local_98,_Var10,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             (_Var10._M_current + lVar15),(allocator_type *)&local_dc);
                  std::
                  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  ::emplace_back<std::vector<int,std::allocator<int>>>
                            (local_50,(vector<int,_std::allocator<int>_> *)&local_98);
                  if (USE_DEPENDENCY_CHECKING == true) {
                    pvVar18 = (this->packing).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    local_dc = (int)((ulong)((long)pvVar18 -
                                            (long)(this->packing).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555 + -1;
                    piVar11 = pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (4 < (ulong)((long)pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar11)
                       ) {
                      uVar12 = 1;
                      do {
                        pvVar26 = (vector<int,std::allocator<int>> *)
                                  ((this->packingMap).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + piVar11[uVar12]);
                        iVar24._M_current = *(int **)(pvVar26 + 8);
                        if (iVar24._M_current == *(int **)(pvVar26 + 0x10)) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    (pvVar26,iVar24,&local_dc);
                          piVar11 = pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          *iVar24._M_current = local_dc;
                          *(int **)(pvVar26 + 8) = iVar24._M_current + 1;
                        }
                        uVar12 = uVar12 + 1;
                      } while (uVar12 < (ulong)((long)pvVar18[-1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                                (long)piVar11 >> 2));
                    }
                    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                    _M_emplace_unique<int&>(local_58,&local_dc);
                    uVar12 = local_b8;
                  }
                  set(this,iVar21,1);
                  if (local_98._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity -
                                    (long)local_98._M_dataplus._M_p);
                  }
                  bVar7 = true;
                }
                uVar28 = (uint)uVar12;
                if (bVar7) break;
              }
LAB_001118ec:
              uVar28 = (uint)uVar12;
              piVar27 = piVar27 + 1;
            } while (piVar27 != local_a8);
          }
        }
      }
      else {
        iVar21 = (this->used).uid;
        (this->used).uid = iVar21 + 1;
        if (iVar21 < -1) {
          piVar11 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar15 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar11;
          if (lVar15 != 0) {
            uVar16 = 0;
            do {
              piVar11[uVar16] = 0;
              uVar16 = uVar16 + 1;
            } while ((uVar16 & 0xffffffff) < (ulong)(lVar15 >> 2));
          }
          (this->used).uid = 1;
        }
        piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar27 = (int *)(local_b8 & 0xffffffff);
        piVar23 = (int *)0x0;
        do {
          piVar4[piVar11[(long)piVar23]] = (this->used).uid;
          piVar3[piVar11[(long)piVar23]] = -1;
          piVar23 = (int *)((long)piVar23 + 1);
        } while (piVar27 != piVar23);
        piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar18 = (this->adj).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar23 = (int *)0x0;
        do {
          iVar21 = piVar11[(long)piVar23];
          piVar25 = pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar13 = *(pointer *)
                     ((long)&pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          if (piVar25 != piVar13) {
            piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar21 = *piVar25;
              if (piVar3[iVar21] < 0) {
                iVar22 = (this->used).uid;
                iVar17 = 1;
                iVar1 = piVar5[iVar21];
                piVar5[iVar21] = iVar22;
                if (iVar1 == iVar22) {
                  iVar17 = piVar4[iVar21];
                  if (iVar17 < 0) goto LAB_00111a98;
                  iVar17 = iVar17 + 1;
                }
                piVar4[iVar21] = iVar17;
              }
              piVar25 = piVar25 + 1;
            } while (piVar25 != piVar13);
          }
          piVar23 = (int *)((long)piVar23 + 1);
        } while (piVar23 != piVar27);
        piVar23 = (int *)0x0;
        pvVar19 = local_b0;
        local_a8 = piVar27;
        do {
          pvVar18 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar21 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)piVar23];
          piVar25 = *(pointer *)
                     ((long)&pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          for (piVar27 = pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar13 = local_a8, piVar27 != piVar25;
              piVar27 = piVar27 + 1) {
            iVar21 = *piVar27;
            piVar11 = (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if ((piVar11[iVar21] < 0) &&
               ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar21] == 1)) {
              _Var10._M_current =
                   (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *_Var10._M_current = 1;
              pvVar18 = (this->adj).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar13 = pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar6 = *(pointer *)
                        ((long)&pvVar18[iVar21].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + 8);
              if (piVar13 == piVar6) {
                lVar15 = 1;
              }
              else {
                piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar21 = 1;
                do {
                  iVar22 = *piVar13;
                  if ((piVar11[iVar22] < 0) && (piVar3[iVar22] != (this->used).uid)) {
                    lVar15 = (long)iVar21;
                    iVar21 = iVar21 + 1;
                    _Var10._M_current[lVar15] = iVar22;
                  }
                  piVar13 = piVar13 + 1;
                } while (piVar13 != piVar6);
                lVar15 = (long)iVar21;
              }
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&local_98,_Var10,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (_Var10._M_current + lVar15),(allocator_type *)&local_dc);
              std::
              vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              ::emplace_back<std::vector<int,std::allocator<int>>>
                        (local_50,(vector<int,_std::allocator<int>_> *)&local_98);
              if (USE_DEPENDENCY_CHECKING == true) {
                pvVar18 = (this->packing).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                local_dc = (int)((ulong)((long)pvVar18 -
                                        (long)(this->packing).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555 + -1;
                piVar11 = pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (4 < (ulong)((long)pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar11)) {
                  uVar16 = 1;
                  do {
                    pvVar26 = (vector<int,std::allocator<int>> *)
                              ((this->packingMap).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + piVar11[uVar16]);
                    iVar24._M_current = *(int **)(pvVar26 + 8);
                    if (iVar24._M_current == *(int **)(pvVar26 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (pvVar26,iVar24,&local_dc);
                      piVar11 = pvVar18[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                    }
                    else {
                      *iVar24._M_current = local_dc;
                      *(int **)(pvVar26 + 8) = iVar24._M_current + 1;
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar16 < (ulong)((long)pvVar18[-1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar11 >> 2));
                }
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_emplace_unique<int&>(local_58,&local_dc);
                pvVar19 = local_b0;
              }
              if (local_98._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_98._M_dataplus._M_p,
                                local_98.field_2._M_allocated_capacity -
                                (long)local_98._M_dataplus._M_p);
              }
            }
          }
          piVar23 = (int *)((long)piVar23 + 1);
        } while (piVar23 != local_a8);
        piVar23 = (int *)0x0;
        uVar28 = (uint)local_b8;
        do {
          iVar21 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)piVar23];
          if ((long)iVar21 == 1) goto LAB_00111a98;
          if (-1 < (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar21]) {
            __assert_fail("x[S[j]] < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x91e,"int branch_and_reduce_algorithm::packingReduction()");
          }
          set(this,iVar21,0);
          piVar23 = (int *)((long)piVar23 + 1);
        } while (piVar13 != piVar23);
      }
      if ((((uint)BRANCHING < 0x20) && ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) != 0)) &&
         (1 < (int)uVar28 && (uint)local_d8 == (int)local_c8 + -1)) {
        lVar15 = 0;
        if (BRANCHING == 0x1f) {
          do {
            piVar23 = (int *)((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar15);
            iVar24._M_current =
                 (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar24._M_current ==
                (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar24,piVar23);
            }
            else {
              *iVar24._M_current = *piVar23;
              *local_68 = iVar24._M_current + 1;
            }
            lVar15 = lVar15 + 4;
          } while ((ulong)uVar28 << 2 != lVar15);
        }
        else {
          do {
            piVar23 = (int *)((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar15);
            iVar24._M_current =
                 (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar24._M_current ==
                (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_70,iVar24,piVar23);
            }
            else {
              *iVar24._M_current = *piVar23;
              *local_60 = iVar24._M_current + 1;
            }
            lVar15 = lVar15 + 4;
          } while ((ulong)uVar28 << 2 != lVar15);
        }
      }
      local_bc = local_bc + 1;
      uVar16 = (ulong)local_bc;
      pvVar18 = (this->packing).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->packing).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3) *
               -0x5555555555555555;
      iVar21 = local_9c;
    } while (uVar16 <= uVar12 && uVar12 - uVar16 != 0);
  }
  __stream = _stderr;
  uVar28 = this->rn;
  if ((2 < debug) && (local_cc != uVar28 && this->depth <= this->maxDepth)) {
    debugString_abi_cxx11_(&local_98,this);
    fprintf(__stream,"%spacking: %d -> %d\n",local_98._M_dataplus._M_p,(ulong)local_cc,
            (ulong)(uint)this->rn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    uVar28 = this->rn;
  }
  uVar28 = (uint)(local_cc != uVar28);
LAB_00111a9d:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar28;
}

Assistant:

int branch_and_reduce_algorithm::packingReduction()
{
    int oldn = rn;
#if 1
    std::vector<int> x2(x);
    int a = -1;
    for (unsigned int pi = 0; pi < packing.size(); ++pi)
    {
        std::vector<int> &ps = packing[pi];
        if (a != rn)
        {
            for (int j = 0; j < N; j++)
                x2[j] = x[j];
            for (int j = modifiedN - 1; j >= 0; j--)
            {
                modifieds[j]->reverse(x2);
            }
            a = rn;
        }
        int max = ps.size() - 1 - ps[0], sum = 0, size = 0;
        std::vector<int> &S = level;
        for (unsigned int j = 1; j < ps.size(); j++)
        {
            int v = ps[j];
            assert(!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end());
            if (x2[v] < 0)
                S[size++] = v;
            if (x2[v] == 1)
                sum++;
        }
        if (sum > max) // constraint not fulfilled => prune branch
        {
            return -1;
        }
        else if (sum == max && size > 0) // set x[v] = 0 for remaining vert.
        {
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int j = 0; j < size; j++) // check if there are adjacent vtcs among remaining vtcs.
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0)
                    {
                        if (used.add(u))
                        {
                            count[u] = 1;
                        }
                        else if (count[u] < 0) // adjacent vtcs => one of them has to be in the vc => prune
                        {
                            return -1;
                        }
                        else
                        {
                            count[u]++;
                        }
                    }
            }
            for (int j = 0; j < size; j++) // create new constraints
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0 && count[u] == 1)
                    {
                        std::vector<int> &tmp = que;
                        int p = 0;
                        tmp[p++] = 1;
                        for (int w : adj[u])
                            if (x[w] < 0 && !used.get(w))
                            {
                                tmp[p++] = w;
                            }
                        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
                        pushPacking(copyOfTmp);
                    }
            }
            for (int j = 0; j < size; j++) // set x[v] = 0 for remaining vtcs
            {
                if (S[j] == 1)
                    return -1;
                assert(x[S[j]] < 0);
                set(S[j], 0);
            }
        }
        else if (sum + size > max) // at least one of the remaining vtcs has to be excluded
        {
            assert(size >= 2);
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int v : adj[S[0]])
                if (x[v] < 0 && !used.get(v))
                {
                    int p = 0; // number of Neighbours in S[-]
                    for (int u : adj[v])
                        if (used.get(u))
                        {
                            p++;
                            count[u] = 1;
                        }
                    if (sum + p > max) // sum + p > max => v has to be in the vc
                    {
                        std::vector<int> &qs = que;
                        int q = 0;
                        qs[q++] = 2;
                        for (int u : adj[v])
                            if (x[u] < 0)
                                qs[q++] = u;
                        std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                        pushPacking(copyOfqs);
                        set(v, 1);
                        break;
                    }
                    else if (BRANCHING == 10 || BRANCHING == 11 || BRANCHING == 31)
                    {
                        if ((sum + 1 + p) > max)
                        {
                            for (int i = 0; i < size; i++)
                                if (count[S[i]] == -1) {
                                    if (BRANCHING == 31) packing_vtcs.push_back(S[i]);
                                    else b_vtcs.push_back(S[i]);
                                }
                        }
                    }
                }
        }

        if (BRANCHING == 10 || BRANCHING == 11 | BRANCHING == 31)
        {
            if (sum == (max - 1) && size > 1)
            {
                if (BRANCHING == 31) {
                    for (int i = 0; i < size; i++) {
                        packing_vtcs.push_back(S[i]);
                    }
                } else {
                    for (int i = 0; i < size; i++) {
                        b_vtcs.push_back(S[i]);
                    }
                }
            }
        }
    }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%spacking: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif // 0
    return oldn != rn ? 1 : 0;
}